

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O2

void __thiscall
GeneralHash<1,_unsigned_int,_unsigned_char>::update
          (GeneralHash<1,_unsigned_int,_unsigned_char> *this,uchar outchar,uchar inchar)

{
  uint uVar1;
  uint z;
  uint local_1c;
  
  uVar1 = this->hashvalue * 2;
  this->hashvalue = uVar1;
  if ((this->lastbit & ~uVar1) == 0) {
    this->hashvalue = uVar1 ^ this->irreduciblepoly;
  }
  local_1c = (this->hasher).hashvalues[outchar];
  fastleftshiftn(this,&local_1c);
  this->hashvalue = this->hashvalue ^ (this->hasher).hashvalues[inchar] ^ local_1c;
  return;
}

Assistant:

void update(chartype outchar, chartype inchar) {
    hashvalue <<= 1;
    if ((hashvalue & lastbit) == lastbit)
      hashvalue ^= irreduciblepoly;
    //
    hashvaluetype z(hasher.hashvalues[outchar]);
    // the compiler should optimize away the next if/else
    if (precomputationtype == FULLPRECOMP) {
      fastleftshiftn(z);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    } else {
      fastleftshift(z, n);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    }
  }